

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreInstPrinter.c
# Opt level: O0

void XCore_printInst(MCInst *MI,SStream *O,void *Info)

{
  MCInst *in_RDI;
  MCRegisterInfo *in_stack_00000020;
  SStream *in_stack_00000028;
  MCInst *in_stack_00000030;
  
  printInstruction(in_stack_00000030,in_stack_00000028,in_stack_00000020);
  set_mem_access(in_RDI,false,0);
  return;
}

Assistant:

void XCore_printInst(MCInst *MI, SStream *O, void *Info)
{
	printInstruction(MI, O, Info);
	set_mem_access(MI, false, 0);
}